

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QHttpHeadersPrivate>::reset
          (QExplicitlySharedDataPointer<QHttpHeadersPrivate> *this,QHttpHeadersPrivate *ptr)

{
  bool bVar1;
  QHttpHeadersPrivate *pQVar2;
  QHttpHeadersPrivate *in_RSI;
  long in_FS_OFFSET;
  QHttpHeadersPrivate *old;
  totally_ordered_wrapper<QHttpHeadersPrivate_*> *in_stack_ffffffffffffffb8;
  QHttpHeadersPrivate **in_stack_ffffffffffffffc0;
  totally_ordered_wrapper<QHttpHeadersPrivate_*> local_20;
  totally_ordered_wrapper<QHttpHeadersPrivate_*> local_18;
  QHttpHeadersPrivate *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = Qt::operator!=<QHttpHeadersPrivate_*,_true>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if (local_10 != (QHttpHeadersPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x1db9ef);
    }
    Qt::totally_ordered_wrapper<QHttpHeadersPrivate_*>::totally_ordered_wrapper(&local_20,local_10);
    local_18 = std::
               exchange<Qt::totally_ordered_wrapper<QHttpHeadersPrivate*>,Qt::totally_ordered_wrapper<QHttpHeadersPrivate*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QHttpHeadersPrivate_*> *)0x1dba0d);
    pQVar2 = Qt::totally_ordered_wrapper<QHttpHeadersPrivate_*>::get(&local_18);
    if (((pQVar2 != (QHttpHeadersPrivate *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1dba33), !bVar1)) &&
       (pQVar2 != (QHttpHeadersPrivate *)0x0)) {
      QHttpHeadersPrivate::~QHttpHeadersPrivate((QHttpHeadersPrivate *)0x1dba51);
      operator_delete(pQVar2,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }